

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O3

void rw::d3d9::instance(ObjPipeline *rwpipe,Atomic *atomic)

{
  ushort uVar1;
  uint uVar2;
  Geometry *geometry;
  long lVar3;
  InstanceDataHeader *pIVar4;
  undefined8 uVar5;
  void *indexBuffer;
  uint16 *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  MeshHeader *pMVar12;
  uint *puVar13;
  
  geometry = atomic->geometry;
  if ((geometry->flags & 0x1000000) != 0) {
    return;
  }
  pIVar4 = geometry->instData;
  if (pIVar4 == (InstanceDataHeader *)0x0) {
LAB_0011568f:
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d9.cpp line: 347"
    ;
    pIVar4 = (InstanceDataHeader *)(*DAT_00149de8)(0x70,0x3000f);
    pMVar12 = geometry->meshHeader;
    pIVar4->platform = 9;
    pIVar4[1].platform = (uint)pMVar12->serialNum;
    uVar1 = pMVar12->numMeshes;
    pIVar4[2].platform = (uint)uVar1;
    pIVar4[6].platform = pMVar12->flags == 1 | 4;
    pIVar4[0x14].platform = 0;
    *(undefined8 *)(pIVar4 + 0x16) = 0;
    pIVar4[0x19].platform = geometry->numVertices;
    pIVar4[0x18].platform = pMVar12->totalIndices;
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d9.cpp line: 358"
    ;
    uVar5 = (*DAT_00149de8)((ulong)uVar1 * 0x30);
    *(undefined8 *)(pIVar4 + 0x1a) = uVar5;
    uVar10 = 0;
    indexBuffer = d3d::createIndexBuffer(pIVar4[0x18].platform * 2,false);
    *(void **)(pIVar4 + 4) = indexBuffer;
    puVar6 = d3d::lockIndices(indexBuffer,0,0,0);
    if (pIVar4[2].platform != 0) {
      pMVar12 = pMVar12 + 1;
      puVar13 = *(uint **)(pIVar4 + 0x1a);
      uVar9 = 0;
      do {
        findMinVertAndNumVertices
                  (*(uint16 **)pMVar12,pMVar12->totalIndices,puVar13 + 1,(int32 *)(puVar13 + 9));
        uVar8 = pMVar12->totalIndices;
        *puVar13 = uVar8;
        *(undefined8 *)(puVar13 + 2) = *(undefined8 *)(pMVar12 + 1);
        puVar13[4] = 0;
        puVar13[6] = 0;
        puVar13[7] = 0;
        uVar2 = puVar13[1];
        puVar13[8] = uVar2;
        puVar13[10] = uVar9;
        if (pIVar4[6].platform == 5) {
          uVar7 = uVar8 - 2;
        }
        else {
          uVar7 = uVar8 / 3;
        }
        puVar13[0xb] = uVar7;
        if (uVar2 == 0) {
          memcpy(puVar6 + uVar9,*(void **)pMVar12,(ulong)(uVar8 * 2));
          uVar8 = *puVar13;
        }
        else if ((ulong)uVar8 == 0) {
          uVar8 = 0;
        }
        else {
          lVar3 = *(long *)pMVar12;
          uVar11 = 0;
          do {
            puVar6[uVar9 + (int)uVar11] = *(short *)(lVar3 + uVar11 * 2) - (short)uVar2;
            uVar11 = uVar11 + 1;
          } while (uVar8 != uVar11);
        }
        uVar9 = uVar9 + uVar8;
        pMVar12 = (MeshHeader *)&pMVar12[1].totalIndices;
        puVar13 = puVar13 + 0xc;
        uVar10 = uVar10 + 1;
      } while (uVar10 < pIVar4[2].platform);
    }
    d3d::unlockIndices(*(void **)(pIVar4 + 4));
    *(undefined8 *)(pIVar4 + 0x10) = 0;
    *(undefined8 *)(pIVar4 + 0x12) = 0;
    *(undefined8 *)(pIVar4 + 0xc) = 0;
    *(undefined8 *)(pIVar4 + 0xe) = 0;
    *(undefined8 *)(pIVar4 + 8) = 0;
    *(undefined8 *)(pIVar4 + 10) = 0;
    geometry->instData = pIVar4;
    (**(code **)&rwpipe[1].super_Pipeline)(geometry,pIVar4,0);
  }
  else {
    if (pIVar4[1].platform != (uint)geometry->meshHeader->serialNum) {
      freeInstanceData(geometry);
      pIVar4 = geometry->instData;
      if (pIVar4 == (InstanceDataHeader *)0x0) goto LAB_0011568f;
    }
    if (geometry->lockedSinceInst != 0) {
      (**(code **)&rwpipe[1].super_Pipeline)(geometry,pIVar4,1);
    }
  }
  geometry->lockedSinceInst = 0;
  return;
}

Assistant:

static void
instance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	// don't try to (re)instance native data
	if(geo->flags & Geometry::NATIVE)
		return;

	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	if(geo->instData){
		// Already have instanced data, so check if we have to reinstance
		assert(header->platform == PLATFORM_D3D9);
		if(header->serialNumber != geo->meshHeader->serialNum){
			// Mesh changed, so reinstance everything
			freeInstanceData(geo);
		}
	}

	// no instance or complete reinstance
	if(geo->instData == nil){
		geo->instData = instanceMesh(rwpipe, geo);
		pipe->instanceCB(geo, (InstanceDataHeader*)geo->instData, 0);
	}else if(geo->lockedSinceInst)
		pipe->instanceCB(geo, (InstanceDataHeader*)geo->instData, 1);

	geo->lockedSinceInst = 0;
}